

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

Nonnull<status_internal::StatusRep_*> absl::lts_20250127::Status::PrepareToModify(uintptr_t rep)

{
  bool bVar1;
  StatusCode code_arg;
  StatusRep *this;
  Nonnull<const_status_internal::StatusRep_*> this_00;
  unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  local_40;
  string_view local_38 [2];
  uintptr_t local_18;
  uintptr_t rep_local;
  
  local_18 = rep;
  bVar1 = IsInlined(rep);
  if (bVar1) {
    this = (StatusRep *)operator_new(0x30);
    code_arg = InlinedRepToCode(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_38);
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>,std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>>>
    ::
    unique_ptr<std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>>,void>
              ((unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>,std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>>>
                *)&local_40,(nullptr_t)0x0);
    status_internal::StatusRep::StatusRep(this,code_arg,local_38[0],&local_40);
    rep_local = (uintptr_t)this;
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ::~unique_ptr(&local_40);
  }
  else {
    this_00 = RepToPointer(local_18);
    rep_local = (uintptr_t)status_internal::StatusRep::CloneAndUnref(this_00);
  }
  return (Nonnull<status_internal::StatusRep_*>)rep_local;
}

Assistant:

absl::Nonnull<status_internal::StatusRep*> Status::PrepareToModify(
    uintptr_t rep) {
  if (IsInlined(rep)) {
    return new status_internal::StatusRep(InlinedRepToCode(rep),
                                          absl::string_view(), nullptr);
  }
  return RepToPointer(rep)->CloneAndUnref();
}